

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

Name __thiscall wasm::WasmBinaryBuilder::getDataName(WasmBinaryBuilder *this,Index index)

{
  pointer puVar1;
  string local_40;
  
  puVar1 = (this->wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)index <
      (ulong)((long)(this->wasm->dataSegments).
                    super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return (IString)(IString)*(string_view *)
                              puVar1[index]._M_t.
                              super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
    ;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"invalid data segment index","");
  throwError(this,&local_40);
}

Assistant:

Name WasmBinaryBuilder::getDataName(Index index) {
  if (index >= wasm.dataSegments.size()) {
    throwError("invalid data segment index");
  }
  return wasm.dataSegments[index]->name;
}